

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

CURLcode Curl_mime_set_subparts(curl_mimepart *part,curl_mime *subparts,int take_ownership)

{
  code *pcVar1;
  bool bVar2;
  curl_mime *local_30;
  curl_mime *root;
  int take_ownership_local;
  curl_mime *subparts_local;
  curl_mimepart *part_local;
  
  if (part == (curl_mimepart *)0x0) {
    part_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else if ((part->kind == MIMEKIND_MULTIPART) && ((curl_mime *)part->arg == subparts)) {
    part_local._4_4_ = CURLE_OK;
  }
  else {
    cleanup_part_content(part);
    if (subparts != (curl_mime *)0x0) {
      if (subparts->parent != (curl_mimepart *)0x0) {
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
      local_30 = part->parent;
      if (local_30 != (curl_mime *)0x0) {
        while( true ) {
          bVar2 = false;
          if (local_30->parent != (curl_mimepart *)0x0) {
            bVar2 = local_30->parent->parent != (curl_mime *)0x0;
          }
          if (!bVar2) break;
          local_30 = local_30->parent->parent;
        }
        if (subparts == local_30) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
      }
      subparts->parent = part;
      part->seekfunc = mime_subparts_seek;
      pcVar1 = mime_subparts_unbind;
      if (take_ownership != 0) {
        pcVar1 = mime_subparts_free;
      }
      part->freefunc = pcVar1;
      part->arg = subparts;
      part->datasize = -1;
      part->kind = MIMEKIND_MULTIPART;
    }
    part_local._4_4_ = CURLE_OK;
  }
  return part_local._4_4_;
}

Assistant:

CURLcode Curl_mime_set_subparts(curl_mimepart *part,
                                curl_mime *subparts, int take_ownership)
{
  curl_mime *root;

  if(!part)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  /* Accept setting twice the same subparts. */
  if(part->kind == MIMEKIND_MULTIPART && part->arg == subparts)
    return CURLE_OK;

  cleanup_part_content(part);

  if(subparts) {
    /* Should not have been attached already. */
    if(subparts->parent)
      return CURLE_BAD_FUNCTION_ARGUMENT;

    /* Should not be the part's root. */
    root = part->parent;
    if(root) {
      while(root->parent && root->parent->parent)
        root = root->parent->parent;
      if(subparts == root) {
        /* Can't add as a subpart of itself. */
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
    }

    subparts->parent = part;
    /* Subparts are processed internally: no read callback. */
    part->seekfunc = mime_subparts_seek;
    part->freefunc = take_ownership? mime_subparts_free: mime_subparts_unbind;
    part->arg = subparts;
    part->datasize = -1;
    part->kind = MIMEKIND_MULTIPART;
  }

  return CURLE_OK;
}